

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall
Matrix::AddColumn(Matrix *this,int first_column,int second_column,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  int row;
  long lVar5;
  Fraction local_48;
  long local_40;
  Fraction local_38;
  
  bVar4 = false;
  local_38 = coefficient;
  Fraction::Fraction(&local_48,0);
  bVar2 = operator==(&local_38,&local_48);
  if ((!bVar2) && (0 < this->n_)) {
    lVar3 = 0;
    local_40 = (long)first_column << 3;
    lVar5 = 0;
    bVar4 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar3);
      Fraction::Fraction(&local_48,0);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)second_column * 8),&local_48);
      if (bVar2) {
        local_48 = operator*(&local_38,
                             (Fraction *)
                             (*(long *)((long)&(((this->elements_).
                                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<Fraction,_std::allocator<Fraction>_>
                                               )._M_impl.super__Vector_impl_data + lVar3) +
                             (long)second_column * 8));
        Fraction::operator+=
                  ((Fraction *)
                   (*(long *)((long)&(((this->elements_).
                                       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                     _M_impl.super__Vector_impl_data + lVar3) + local_40),&local_48)
        ;
        bVar4 = true;
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar5 < this->n_);
  }
  return bVar4;
}

Assistant:

bool Matrix::AddColumn(int first_column, int second_column, Fraction coefficient) {
  if (coefficient == 0) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][second_column] != 0) {
      result = true;
      elements_[row][first_column] += coefficient * elements_[row][second_column];
    }
  }

  return result;
}